

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

int32_t container_size_in_bytes(container_t *c,uint8_t typecode)

{
  undefined3 in_register_00000031;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000031,typecode);
  if (uVar1 == 4) {
    uVar1 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar1 != '\x01') {
    if ((uVar1 & 0xff) == 3) {
      return *c * 4 + 2;
    }
    return *c * 2;
  }
  return 0x2000;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type) {
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}